

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBruteForceSearch.h
# Opt level: O1

bool __thiscall
BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverBruteForceSearch<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  int *piVar1;
  char cVar2;
  JointPolicyDiscretePure *__tmp;
  undefined8 *puVar3;
  bool bVar4;
  double dVar5;
  shared_ptr<JointPolicyPureVectorForClusteredBG> test;
  shared_ptr<PartialJointPolicyDiscretePure> pjpdp;
  shared_ptr<PartialJPDPValuePair> jppv;
  element_type *local_88;
  shared_count sStack_80;
  element_type *local_78;
  shared_count local_70;
  long *local_68;
  shared_count local_60;
  shared_ptr<JointPolicyPureVector> local_58;
  undefined8 local_40;
  shared_count sStack_38;
  
  if (this->_m_solved == false) {
    (**(code **)(*(long *)&(this->
                           super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>
                           ).super_BGIP_IncrementalSolverInterface + 0x20))(this);
  }
  *value = 0.0;
  cVar2 = BGIPSolution::IsEmptyJPPV();
  if (cVar2 == '\0') {
    BGIPSolution::GetNextSolutionJPPV();
    dVar5 = (double)(**(code **)(*local_68 + 0x18))();
    *value = dVar5;
    if (this->_m_CBGlowerBound <= dVar5) {
      local_58.px = (element_type *)local_68[2];
      local_58.pn.pi_ = (sp_counted_base *)local_68[3];
      if (local_68[3] != 0) {
        LOCK();
        piVar1 = (int *)(local_68[3] + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
                ((boost *)&local_78,&local_58);
      boost::detail::shared_count::~shared_count(&local_58.pn);
      bVar4 = local_78 != (element_type *)0x0;
      if (bVar4) {
        if (local_70.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_88 = (element_type *)0x0;
        sStack_80.pi_ = (sp_counted_base *)0x0;
        local_58.px = (element_type *)jpol->px;
        local_58.pn.pi_ = (jpol->pn).pi_;
        jpol->px = local_78;
        (jpol->pn).pi_ = local_70.pi_;
        boost::detail::shared_count::~shared_count(&local_58.pn);
        boost::detail::shared_count::~shared_count(&sStack_80);
        BGIPSolution::PopNextSolutionJPPV();
      }
LAB_00114654:
      boost::detail::shared_count::~shared_count(&local_70);
    }
    else {
      bVar4 = false;
    }
  }
  else {
    cVar2 = BGIPSolution::IsEmptyPJPDP();
    if (cVar2 != '\0') {
      bVar4 = false;
      goto LAB_00114668;
    }
    BGIPSolution::GetNextSolutionPJPDP();
    dVar5 = (double)(**(code **)(*local_68 + 0x18))();
    *value = dVar5;
    bVar4 = this->_m_CBGlowerBound <= dVar5;
    if (bVar4) {
      (**(code **)(*local_68 + 0x10))(&local_78);
      boost::
      dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
                ((boost *)&local_88,(shared_ptr<PartialJointPolicyDiscretePure> *)&local_78);
      if (local_88 == (element_type *)0x0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar3 = &PTR__E_0012be60;
        puVar3[1] = puVar3 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar3 + 1),
                   "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!","");
        __cxa_throw(puVar3,&E::typeinfo,E::~E);
      }
      if (sStack_80.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_80.pi_)->use_count_ = (sStack_80.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_40 = 0;
      sStack_38.pi_ = (sp_counted_base *)0x0;
      local_58.px = (element_type *)jpol->px;
      local_58.pn.pi_ = (jpol->pn).pi_;
      jpol->px = local_88;
      (jpol->pn).pi_ = sStack_80.pi_;
      boost::detail::shared_count::~shared_count(&local_58.pn);
      boost::detail::shared_count::~shared_count(&sStack_38);
      BGIPSolution::PopNextSolutionPJPDP();
      boost::detail::shared_count::~shared_count(&sStack_80);
      goto LAB_00114654;
    }
  }
  boost::detail::shared_count::~shared_count(&local_60);
LAB_00114668:
  if (bVar4 == false) {
    local_58.px = (element_type *)jpol->px;
    local_58.pn.pi_ = (jpol->pn).pi_;
    jpol->px = (element_type *)0x0;
    (jpol->pn).pi_ = (sp_counted_base *)0x0;
    boost::detail::shared_count::~shared_count(&local_58.pn);
    *value = 0.0;
  }
  return bVar4;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
#if DGNJPAV
        std::cout << "DEBUG: GetNextJointPolicyAndValue called" <<std::endl <<
            "\texpecting a pointer to a "<< typeid(jpol).name() << std::endl;

#endif

        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from JPPV queue" <<std::endl;
#endif
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(jppv->GetJPPV());
                if(test)
                {
                    foundSolution = true;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionJPPV();
                }
            }
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"
            //
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting from PJPDP queue" <<std::endl;
#endif
            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
            if(value >= _m_CBGlowerBound)
            {
                
                boost::shared_ptr<PartialJointPolicyDiscretePure> pjpdp = jppv->GetJPol();
                boost::shared_ptr<JP> test = boost::dynamic_pointer_cast<JP>(pjpdp);
#if DGNJPAV
                std::cout << "\tconversion requested from "<<  typeid( jppv->GetJPol() ).name() 
                          << " to " <<              typeid( test ).name()
                          << std::endl
                          << "\tthe former is a pointer to " <<  typeid( *(jppv->GetJPol()) ).name() 
                          << " ." << std::endl;
#endif
                if(test)
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion success" <<std::endl;
#endif
                    foundSolution = true;
                    //jpol = test;
                    jpol = boost::static_pointer_cast<JointPolicyDiscretePure>(test);
                    this->PopNextSolutionPJPDP();
                }
                else
                {
#if DGNJPAV
                    std::cout << "DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!" <<std::endl;
#endif
                    throw E("DEBUG: GetNextJointPolicyAndValue - PJPDP conversion failed!");
                }
            }
        }
        else
        {
#if DGNJPAV
            std::cout << "DEBUG: GetNextJointPolicyAndValue - selecting ERROR - both queues empty?!?" <<std::endl;
#endif
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }
//             std::cout << "found jpol " << jpol << " value " << value << " and " 
//                       << this->GetNrFoundSolutions()
//                       << " solutions left" 
//                       << std::endl;

        return(foundSolution);
    }